

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

crn_format crnd::crnd_get_fundamental_dxt_format(crn_format fmt)

{
  crn_format fmt_local;
  
  fmt_local = fmt;
  if ((ulong)(fmt + ~cCRNFmtDXT5) < 4) {
    fmt_local = cCRNFmtDXT5;
  }
  return fmt_local;
}

Assistant:

crn_format crnd_get_fundamental_dxt_format(crn_format fmt)
    {
        switch (fmt)
        {
            case cCRNFmtDXT5_CCxY:
            case cCRNFmtDXT5_xGxR:
            case cCRNFmtDXT5_xGBR:
            case cCRNFmtDXT5_AGBR:
                return cCRNFmtDXT5;
            default:
                break;
        }
        return fmt;
    }